

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetM33fAttribute(ImfHeader *hdr,char *name,float (*m) [3])

{
  undefined1 uVar1;
  iterator this;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *this_00;
  Matrix33<float> *this_01;
  float (*in_RDX) [3];
  ImfHeader *in_RDI;
  char *unaff_retaddr;
  Header *in_stack_00000008;
  exception *e;
  M33f m3;
  Attribute *in_stack_000004e0;
  char *in_stack_000004e8;
  Header *in_stack_000004f0;
  Header *in_stack_fffffffffffffef8;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff28;
  Matrix33<float> local_44;
  ImfHeader *local_10;
  
  local_10 = in_RDI;
  Imath_3_2::Matrix33<float>::Matrix33(&local_44,in_RDX);
  anon_unknown.dwarf_70604::header(local_10);
  Imf_3_4::Header::find(in_stack_00000008,unaff_retaddr);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff00,(Iterator *)in_stack_fffffffffffffef8);
  anon_unknown.dwarf_70604::header(local_10);
  this._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_fffffffffffffef8);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff00,(Iterator *)in_stack_fffffffffffffef8);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff00,
                              (ConstIterator *)in_stack_fffffffffffffef8);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(local_10);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute
              (in_stack_ffffffffffffff00,(Matrix33<float> *)in_stack_fffffffffffffef8);
    Imf_3_4::Header::insert(in_stack_000004f0,in_stack_000004e8,in_stack_000004e0);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x19d5eb);
  }
  else {
    anon_unknown.dwarf_70604::header(local_10);
    this_00 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                        ((Header *)this._M_node,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    this_01 = Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::value(this_00);
    Imath_3_2::Matrix33<float>::operator=(this_01,&local_44);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM33fAttribute (
    ImfHeader* hdr, const char name[], const float m[3][3])
{
    try
    {
        M33f m3 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute (m3));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute> (name)
                .value () = m3;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}